

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall Centaurus::NFA<wchar_t>::concat(NFA<wchar_t> *this,NFA<wchar_t> *nfa)

{
  bool bVar1;
  size_type sVar2;
  pointer this_00;
  reference this_01;
  const_reference src;
  NFABaseState<wchar_t,_int> local_60;
  __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
  local_38;
  __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
  local_30;
  __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
  local_28;
  __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
  i;
  int initial_size;
  NFA<wchar_t> *nfa_local;
  NFA<wchar_t> *this_local;
  
  sVar2 = std::
          vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
          ::size(&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states);
  i._M_current._4_4_ = (int)sVar2;
  local_30._M_current =
       (NFABaseState<wchar_t,_int> *)
       std::
       vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
       ::cbegin(&(nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states);
  local_28 = __gnu_cxx::
             __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
             ::operator+(&local_30,1);
  while( true ) {
    local_38._M_current =
         (NFABaseState<wchar_t,_int> *)
         std::
         vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
         ::cend(&(nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
              ::operator->(&local_28);
    NFABaseState<wchar_t,_int>::offset(&local_60,this_00,i._M_current._4_4_ + -1);
    std::
    vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
    ::push_back(&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states,&local_60);
    NFABaseState<wchar_t,_int>::~NFABaseState(&local_60);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
    ::operator++(&local_28,0);
  }
  this_01 = std::
            vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
            ::operator[](&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states,
                         (long)(i._M_current._4_4_ + -1));
  src = std::
        vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
        ::operator[](&(nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states,0);
  NFABaseState<wchar_t,_int>::rebase_transitions(this_01,src,i._M_current._4_4_ + -1);
  return;
}

Assistant:

void concat(const NFA<TCHAR>& nfa)
    {
        int initial_size = m_states.size();

        auto i = nfa.m_states.cbegin() + 1;

        for (; i != nfa.m_states.cend(); i++)
        {
            m_states.push_back(i->offset(initial_size - 1));
        }

        m_states[initial_size - 1].rebase_transitions(nfa.m_states[0], initial_size - 1);
    }